

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econ.cpp
# Opt level: O2

void __thiscall CEcon::Update(CEcon *this)

{
  CNetConsole *this_00;
  long lVar1;
  CNetBan *pCVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int64 iVar6;
  int64 iVar7;
  uint uVar8;
  int64 *piVar9;
  long lVar10;
  long in_FS_OFFSET;
  int ClientID;
  char aMsg [128];
  char aBuf [1400];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_Ready == false) {
    bVar4 = Open(this);
    if (!bVar4) {
LAB_0012fc7d:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
  }
  this_00 = &this->m_NetConsole;
  CNetConsole::Update(this_00);
  do {
    do {
      while( true ) {
        do {
          while( true ) {
            iVar5 = CNetConsole::Recv(this_00,aBuf,0x577,&ClientID);
            if (iVar5 == 0) {
              piVar9 = &this->m_aClients[0].m_TimeConnected;
              for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
                if (((CClient *)(piVar9 + -1))->m_State == 1) {
                  iVar6 = time_get();
                  lVar3 = *piVar9;
                  iVar5 = this->m_pConfig->m_EcAuthTimeout;
                  iVar7 = time_freq();
                  if (iVar7 * iVar5 + lVar3 < iVar6) {
                    CNetConsole::Drop(this_00,(int)lVar10,"authentication timeout");
                  }
                }
                piVar9 = piVar9 + 3;
              }
              goto LAB_0012fc7d;
            }
            dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/econ.cpp"
                           ,0x95,(uint)(this->m_aClients[ClientID].m_State != 0),
                           "got message from empty slot");
            iVar5 = this->m_aClients[ClientID].m_State;
            if (iVar5 != 2) break;
            str_format(aMsg,0x100,"cid=%d cmd=\'%s\'",(long)ClientID,aBuf);
            (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                      (this->m_pConsole,1,"server",aMsg,0);
            this->m_UserClientID = ClientID;
            (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x13])(this->m_pConsole,aBuf);
            this->m_UserClientID = -1;
          }
        } while (iVar5 != 1);
        iVar5 = str_comp(aBuf,this->m_pConfig->m_EcPassword);
        lVar10 = (long)ClientID;
        if (iVar5 != 0) break;
        this->m_aClients[lVar10].m_State = 2;
        CNetConsole::Send(this_00,ClientID,
                          "Authentication successful. External console access granted.");
        net_addr_str((NETADDR *)&(this->m_NetConsole).m_aSlots[ClientID].m_Connection.m_PeerAddr,
                     aMsg,0x30,1);
        str_format(aBuf,0x578,"cid=%d addr=%s  authed",(ulong)(uint)ClientID,aMsg);
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (this->m_pConsole,0,"econ",aBuf,0);
      }
      uVar8 = this->m_aClients[lVar10].m_AuthTries + 1;
      this->m_aClients[lVar10].m_AuthTries = uVar8;
      str_format(aMsg,0x80,"Wrong password %d/%d.",(ulong)uVar8,3);
      CNetConsole::Send(this_00,ClientID,aMsg);
    } while (this->m_aClients[ClientID].m_AuthTries < 3);
    iVar5 = this->m_pConfig->m_EcBantime;
    if (iVar5 != 0) {
      pCVar2 = (this->m_NetConsole).m_pNetBan;
      (*pCVar2->_vptr_CNetBan[2])
                (pCVar2,&(this->m_NetConsole).m_aSlots[ClientID].m_Connection.m_PeerAddr,
                 (ulong)(uint)(iVar5 * 0x3c),"Too many authentication tries");
    }
    CNetConsole::Drop(this_00,ClientID,"Too many authentication tries");
  } while( true );
}

Assistant:

void CEcon::Update()
{
	if(!m_Ready && !Open())
		return;	

	m_NetConsole.Update();

	char aBuf[NET_MAX_PACKETSIZE];
	int ClientID;

	while(m_NetConsole.Recv(aBuf, (int)(sizeof(aBuf))-1, &ClientID))
	{
		dbg_assert(m_aClients[ClientID].m_State != CClient::STATE_EMPTY, "got message from empty slot");
		if(m_aClients[ClientID].m_State == CClient::STATE_CONNECTED)
		{
			if(str_comp(aBuf, m_pConfig->m_EcPassword) == 0)
			{
				m_aClients[ClientID].m_State = CClient::STATE_AUTHED;
				m_NetConsole.Send(ClientID, "Authentication successful. External console access granted.");

				char aAddrStr[NETADDR_MAXSTRSIZE];
				net_addr_str(m_NetConsole.ClientAddr(ClientID), aAddrStr, sizeof(aAddrStr), true);
				str_format(aBuf, sizeof(aBuf), "cid=%d addr=%s  authed", ClientID, aAddrStr);
				Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "econ", aBuf);
			}
			else
			{
				m_aClients[ClientID].m_AuthTries++;
				char aMsg[128];
				str_format(aMsg, sizeof(aMsg), "Wrong password %d/%d.", m_aClients[ClientID].m_AuthTries, MAX_AUTH_TRIES);
				m_NetConsole.Send(ClientID, aMsg);
				if(m_aClients[ClientID].m_AuthTries >= MAX_AUTH_TRIES)
				{
					if(m_pConfig->m_EcBantime)
						m_NetConsole.NetBan()->BanAddr(m_NetConsole.ClientAddr(ClientID), m_pConfig->m_EcBantime*60, "Too many authentication tries");
					m_NetConsole.Drop(ClientID, "Too many authentication tries");
				}
			}
		}
		else if(m_aClients[ClientID].m_State == CClient::STATE_AUTHED)
		{
			char aFormatted[256];
			str_format(aFormatted, sizeof(aFormatted), "cid=%d cmd='%s'", ClientID, aBuf);
			Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "server", aFormatted);
			m_UserClientID = ClientID;
			Console()->ExecuteLine(aBuf);
			m_UserClientID = -1;
		}
	}

	for(int i = 0; i < NET_MAX_CONSOLE_CLIENTS; ++i)
	{
		if(m_aClients[i].m_State == CClient::STATE_CONNECTED &&
			time_get() > m_aClients[i].m_TimeConnected + m_pConfig->m_EcAuthTimeout * time_freq())
			m_NetConsole.Drop(i, "authentication timeout");
	}
}